

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<void_const*,(anonymous_namespace)::Data>::emplace_helper<(anonymous_namespace)::Data_const&>
          (QHash<void_const*,(anonymous_namespace)::Data> *this,void **key,Data *args)

{
  byte bVar1;
  Entry *pEVar2;
  long lVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  iterator iVar5;
  undefined1 local_38 [24];
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *local_20;
  
  local_20 = *(Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> **)
              (in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
  findOrInsert<void_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> **)this,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    lVar3 = (ulong)bVar1 * 0x10;
    *(void **)pEVar2[bVar1].storage.data = *key;
    pvVar4 = args->pointer;
  }
  else {
    pvVar4 = args->pointer;
    lVar3 = (ulong)bVar1 << 4;
  }
  *(void **)((pEVar2->storage).data + lVar3 + 8) = pvVar4;
  if (*(Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> **)
       (in_FS_OFFSET + 0x28) == local_20) {
    iVar5.i.bucket = (size_t)pvVar4;
    iVar5.i.d = *(Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> **)
                 (in_FS_OFFSET + 0x28);
    return (iterator)iVar5.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }